

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ParsedParameterVector *
pbrt::
parseParameters<std::function<pstd::optional<pbrt::Token>(int)>,pbrt::parse(pbrt::SceneRepresentation*,std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>)::__5>
          (function<pstd::optional<pbrt::Token>_(int)> *nextToken,anon_class_8_1_6da50f9a ungetToken
          ,Allocator alloc,bool formatting,
          function<void_(const_pbrt::Token_&,_const_char_*)> *errorCallback)

{
  char **ppcVar1;
  Token t_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar2;
  Token *pTVar3;
  const_iterator pvVar4;
  const_iterator pvVar5;
  anon_class_24_3_4da73ed2 *this;
  anon_class_24_3_4da73ed2 *paVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  iterator pbVar7;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  byte in_R8B;
  undefined8 in_R9;
  string_view sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  Token val;
  anon_class_24_3_4da73ed2 addVal;
  ValType valType;
  const_iterator nameEnd;
  const_iterator nameBegin;
  const_iterator typeEnd;
  const_iterator typeBegin;
  anon_class_8_1_898aa9a8 skipToSpace;
  anon_class_8_1_898aa9a8 skipSpace;
  string_view decl;
  ParsedParameter *param;
  optional<pbrt::Token> t;
  ParsedParameterVector *parameterVector;
  char *in_stack_fffffffffffffc58;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffc60;
  allocator<char> *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc74;
  function<pstd::optional<pbrt::Token>_(int)> *in_stack_fffffffffffffc78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  undefined6 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8e;
  undefined1 in_stack_fffffffffffffc8f;
  iterator in_stack_fffffffffffffc90;
  iterator in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  Token *in_stack_fffffffffffffcc8;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  Token *in_stack_fffffffffffffce8;
  iterator local_248;
  undefined1 local_198 [40];
  undefined4 *local_170;
  undefined8 local_168;
  ParsedParameter **local_160;
  undefined4 local_154;
  const_iterator local_150;
  anon_class_24_3_4da73ed2 *local_120;
  const_iterator local_118;
  const_iterator local_e8;
  basic_string_view<char,_std::char_traits<char>_> *local_e0;
  basic_string_view<char,_std::char_traits<char>_> *local_d8;
  string_view local_d0;
  ParsedParameter *local_c0;
  char *local_b8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIStack_b0;
  allocator<char> *paStack_a8;
  char *pcStack_a0;
  function<pstd::optional<pbrt::Token>_(int)> *local_98;
  size_t local_90;
  char *local_88;
  int local_80;
  optional<pbrt::Token> local_70;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_40;
  byte local_31;
  undefined8 local_30;
  byte local_21;
  
  local_21 = in_R8B & 1;
  local_31 = 0;
  local_30 = in_R9;
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            (&in_stack_fffffffffffffc60->alloc);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_RDI,&local_40);
  do {
    std::function<pstd::optional<pbrt::Token>_(int)>::operator()
              (in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
    bVar2 = pstd::optional<pbrt::Token>::has_value(&local_70);
    if (bVar2) {
      pTVar3 = pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x44e0ba);
      local_90 = (pTVar3->token)._M_len;
      local_88 = (pTVar3->token)._M_str;
      sVar8._M_str = (char *)in_stack_fffffffffffffc60;
      sVar8._M_len = (size_t)in_stack_fffffffffffffc58;
      bVar2 = isQuotedString(sVar8);
      if (bVar2) {
        pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x44e1a4);
        local_c0 = pstd::pmr::polymorphic_allocator<std::byte>::
                   new_object<pbrt::ParsedParameter,pstd::pmr::polymorphic_allocator<std::byte>&,pbrt::FileLoc&>
                             ((polymorphic_allocator<std::byte> *)
                              CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                              (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffc68,
                              (FileLoc *)in_stack_fffffffffffffc60);
        pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x44e1f1);
        sVar8 = dequoteString(in_stack_fffffffffffffcc8);
        local_e0 = &local_d0;
        local_d8 = local_e0;
        local_d0 = sVar8;
        std::basic_string_view<char,_std::char_traits<char>_>::begin(local_e0);
        pvVar4 = parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
                 ::anon_class_8_1_898aa9a8::operator()
                           ((anon_class_8_1_898aa9a8 *)in_stack_fffffffffffffc80,
                            (const_iterator)in_stack_fffffffffffffc78);
        local_e8 = pvVar4;
        pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::end(&local_d0);
        if (pvVar4 == pvVar5) {
          pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x44e2bf);
          std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_d0);
          std::basic_string_view<char,_std::char_traits<char>_>::end(&local_d0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char_const*,void>
                    (in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
                     (char *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc68);
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                     (char *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
        }
        local_118 = parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
                    ::anon_class_8_1_898aa9a8::operator()
                              ((anon_class_8_1_898aa9a8 *)
                               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                               (const_iterator)in_stack_fffffffffffffc68);
        std::__cxx11::string::assign<char_const*,void>
                  (in_stack_fffffffffffffc90,
                   (char *)CONCAT17(in_stack_fffffffffffffc8f,
                                    CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)),
                   (char *)in_stack_fffffffffffffc80);
        if ((local_21 & 1) != 0) {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
          if (bVar2) {
            std::__cxx11::string::operator=((string *)local_c0,"point3");
          }
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
          if (bVar2) {
            std::__cxx11::string::operator=((string *)local_c0,"rgb");
          }
        }
        this = (anon_class_24_3_4da73ed2 *)
               parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
               ::anon_class_8_1_898aa9a8::operator()
                         ((anon_class_8_1_898aa9a8 *)in_stack_fffffffffffffc80,
                          (const_iterator)in_stack_fffffffffffffc78);
        local_120 = this;
        paVar6 = (anon_class_24_3_4da73ed2 *)
                 std::basic_string_view<char,_std::char_traits<char>_>::end(&local_d0);
        if (this == paVar6) {
          pstd::optional<pbrt::Token>::operator->((optional<pbrt::Token> *)0x44e501);
          this_01 = &local_d0;
          std::basic_string_view<char,_std::char_traits<char>_>::begin(this_01);
          std::basic_string_view<char,_std::char_traits<char>_>::end(this_01);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char_const*,void>
                    (in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
                     (char *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc68);
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                     (char *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
        }
        local_150 = parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
                    ::anon_class_8_1_898aa9a8::operator()
                              ((anon_class_8_1_898aa9a8 *)
                               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                               (const_iterator)in_stack_fffffffffffffc68);
        std::__cxx11::string::assign<char_const*,void>
                  (in_stack_fffffffffffffc90,
                   (char *)CONCAT17(in_stack_fffffffffffffc8f,
                                    CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)),
                   (char *)in_stack_fffffffffffffc80);
        local_154 = 0;
        local_170 = &local_154;
        local_168 = local_30;
        local_160 = &local_c0;
        std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                  (in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
        pTVar3 = pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x44e692);
        memcpy(local_198,pTVar3,0x28);
        pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x44e6bd);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                   (char *)in_stack_fffffffffffffc68);
        __x._M_len._6_1_ = in_stack_fffffffffffffc8e;
        __x._M_len._0_6_ = in_stack_fffffffffffffc88;
        __x._M_len._7_1_ = in_stack_fffffffffffffc8f;
        __x._M_str = (char *)in_stack_fffffffffffffc90;
        __y._M_str = (char *)in_stack_fffffffffffffc80;
        __y._M_len = (size_t)in_stack_fffffffffffffc78;
        bVar2 = std::operator==(__x,__y);
        if (bVar2) {
          while( true ) {
            std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                      (in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
            pTVar3 = pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x44e74c);
            memcpy(local_198,pTVar3,0x28);
            pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x44e777);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       (char *)in_stack_fffffffffffffc68);
            __x_00._M_len._6_1_ = in_stack_fffffffffffffc8e;
            __x_00._M_len._0_6_ = in_stack_fffffffffffffc88;
            __x_00._M_len._7_1_ = in_stack_fffffffffffffc8f;
            __x_00._M_str = (char *)in_stack_fffffffffffffc90;
            __y_00._M_str = (char *)in_stack_fffffffffffffc80;
            __y_00._M_len = (size_t)in_stack_fffffffffffffc78;
            bVar2 = std::operator==(__x_00,__y_00);
            if (bVar2) break;
            parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
            ::anon_class_24_3_4da73ed2::operator()(this,in_stack_fffffffffffffce8);
          }
        }
        else {
          parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
          ::anon_class_24_3_4da73ed2::operator()(this,in_stack_fffffffffffffce8);
        }
        if ((local_21 & 1) != 0) {
          in_stack_fffffffffffffca7 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
          if ((bool)in_stack_fffffffffffffca7) {
            this_00 = &local_c0->strings;
            local_248 = pstd::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::begin(this_00);
            in_stack_fffffffffffffc98 = local_248;
            pbVar7 = pstd::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(this_00);
            in_stack_fffffffffffffc90 = pbVar7;
            for (; local_248 != pbVar7; local_248 = local_248 + 1) {
              in_stack_fffffffffffffc8f =
                   std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
              if ((bool)in_stack_fffffffffffffc8f) {
                pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
                push_back((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *
                          )CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                          (uchar *)in_stack_fffffffffffffc68);
              }
              else {
                in_stack_fffffffffffffc8e =
                     std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
                if ((bool)in_stack_fffffffffffffc8e) {
                  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
                  push_back((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>
                             *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                            (uchar *)in_stack_fffffffffffffc68);
                }
                else {
                  Error<std::__cxx11::string_const&>
                            ((FileLoc *)
                             CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                             (char *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
                }
              }
            }
            pstd::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffc60);
          }
        }
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::push_back((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                     *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                    (ParsedParameter **)in_stack_fffffffffffffc68);
        local_80 = 0;
      }
      else {
        pTVar3 = pstd::optional<pbrt::Token>::operator*((optional<pbrt::Token> *)0x44e10d);
        in_stack_fffffffffffffc78 =
             *(function<pstd::optional<pbrt::Token>_(int)> **)&(pTVar3->loc).line;
        in_stack_fffffffffffffc58 = (char *)(pTVar3->token)._M_len;
        in_stack_fffffffffffffc60 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)(pTVar3->token)._M_str;
        in_stack_fffffffffffffc68 = (allocator<char> *)(pTVar3->loc).filename._M_len;
        ppcVar1 = &(pTVar3->loc).filename._M_str;
        pcStack_a0 = *ppcVar1;
        in_stack_fffffffffffffc70 = SUB84(pcStack_a0,0);
        in_stack_fffffffffffffc74 = (int)((ulong)pcStack_a0 >> 0x20);
        t_00.loc.filename._M_len = (size_t)in_stack_fffffffffffffc80;
        t_00.token = (string_view)*(undefined1 (*) [16])ppcVar1;
        t_00.loc.filename._M_str._0_6_ = in_stack_fffffffffffffc88;
        t_00.loc.filename._M_str._6_1_ = in_stack_fffffffffffffc8e;
        t_00.loc.filename._M_str._7_1_ = in_stack_fffffffffffffc8f;
        t_00.loc._16_8_ = in_stack_fffffffffffffc90;
        local_b8 = in_stack_fffffffffffffc58;
        pIStack_b0 = in_stack_fffffffffffffc60;
        paStack_a8 = in_stack_fffffffffffffc68;
        local_98 = in_stack_fffffffffffffc78;
        parse::anon_class_8_1_6da50f9a::operator()
                  ((anon_class_8_1_6da50f9a *)in_stack_fffffffffffffc60,t_00);
        local_31 = 1;
        local_80 = 1;
      }
    }
    else {
      local_31 = 1;
      local_80 = 1;
    }
    pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)0x44ea29);
    if (local_80 != 0) {
      if ((local_31 & 1) == 0) {
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::~InlinedVector(in_stack_fffffffffffffc60);
      }
      return in_RDI;
    }
  } while( true );
}

Assistant:

static ParsedParameterVector parseParameters(
    Next nextToken, Unget ungetToken, Allocator alloc, bool formatting,
    const std::function<void(const Token &token, const char *)> &errorCallback) {
    ParsedParameterVector parameterVector;

    while (true) {
        pstd::optional<Token> t = nextToken(TokenOptional);
        if (!t.has_value())
            return parameterVector;

        if (!isQuotedString(t->token)) {
            ungetToken(*t);
            return parameterVector;
        }

        ParsedParameter *param = alloc.new_object<ParsedParameter>(alloc, t->loc);

        std::string_view decl = dequoteString(*t);

        auto skipSpace = [&decl](std::string_view::const_iterator iter) {
            while (iter != decl.end() && (*iter == ' ' || *iter == '\t'))
                ++iter;
            return iter;
        };
        // Skip to the next whitespace character (or the end of the string).
        auto skipToSpace = [&decl](std::string_view::const_iterator iter) {
            while (iter != decl.end() && *iter != ' ' && *iter != '\t')
                ++iter;
            return iter;
        };

        auto typeBegin = skipSpace(decl.begin());
        if (typeBegin == decl.end())
            ErrorExit(&t->loc, "Parameter \"%s\" doesn't have a type declaration?!",
                      std::string(decl.begin(), decl.end()));

        // Find end of type declaration
        auto typeEnd = skipToSpace(typeBegin);
        param->type.assign(typeBegin, typeEnd);

        if (formatting) {  // close enough: upgrade...
            if (param->type == "point")
                param->type = "point3";
            if (param->type == "color")
                param->type = "rgb";
        }

        auto nameBegin = skipSpace(typeEnd);
        if (nameBegin == decl.end())
            ErrorExit(&t->loc, "Unable to find parameter name from \"%s\"",
                      std::string(decl.begin(), decl.end()));

        auto nameEnd = skipToSpace(nameBegin);
        param->name.assign(nameBegin, nameEnd);

        enum ValType { Unknown, String, Bool, Number } valType = Unknown;

        auto addVal = [&](const Token &t) {
            if (isQuotedString(t.token)) {
                switch (valType) {
                case Unknown:
                    valType = String;
                    break;
                case String:
                    break;
                case Number:
                    errorCallback(t, "expected number");
                case Bool:
                    errorCallback(t, "expected bool");
                }

                param->AddString(dequoteString(t));
            } else if (t.token[0] == 't' && t.token == "true") {
                switch (valType) {
                case Unknown:
                    valType = Bool;
                    break;
                case String:
                    errorCallback(t, "expected string");
                case Number:
                    errorCallback(t, "expected number");
                case Bool:
                    break;
                }

                param->AddBool(true);
            } else if (t.token[0] == 'f' && t.token == "false") {
                switch (valType) {
                case Unknown:
                    valType = Bool;
                    break;
                case String:
                    errorCallback(t, "expected string");
                case Number:
                    errorCallback(t, "expected number");
                case Bool:
                    break;
                }

                param->AddBool(false);
            } else {
                switch (valType) {
                case Unknown:
                    valType = Number;
                    break;
                case String:
                    errorCallback(t, "expected string");
                case Number:
                    break;
                case Bool:
                    errorCallback(t, "expected bool");
                }

                param->AddNumber(parseNumber(t));
            }
        };

        Token val = *nextToken(TokenRequired);

        if (val.token == "[") {
            while (true) {
                val = *nextToken(TokenRequired);
                if (val.token == "]")
                    break;
                addVal(val);
            }
        } else {
            addVal(val);
        }

        if (formatting && param->type == "bool") {
            for (const auto &b : param->strings) {
                if (b == "true")
                    param->bools.push_back(true);
                else if (b == "false")
                    param->bools.push_back(false);
                else
                    Error(&param->loc,
                          "%s: neither \"true\" nor \"false\" in bool "
                          "parameter list.",
                          b);
            }
            param->strings.clear();
        }

        parameterVector.push_back(param);
    }

    return parameterVector;
}